

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_pax.c
# Opt level: O2

void test_write_format_pax(void)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  void *buff;
  archive *paVar4;
  la_ssize_t lVar5;
  time_t tVar6;
  long lVar7;
  char *pcVar8;
  la_int64_t lVar9;
  uint uVar10;
  archive_entry *ae;
  void *local_460;
  archive *local_458;
  size_t used;
  int64_t length;
  int64_t offset;
  char nulls [1024];
  
  buff = malloc(1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L')',(uint)(buff != (void *)0x0),"buff != NULL",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L',',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'-',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax(a)",paVar4);
  iVar1 = archive_write_add_filter_none(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'.',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar4);
  local_460 = buff;
  iVar1 = archive_write_open_memory(paVar4,buff,1000000,&used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'/',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, &used)",paVar4);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'4',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_atime(ae,2,0x14);
  archive_entry_set_birthtime(ae,3,0x1e);
  archive_entry_set_ctime(ae,4,0x28);
  archive_entry_set_mtime(ae,5,0x32);
  archive_entry_copy_pathname(ae,"file");
  archive_entry_set_mode(ae,0x81ed);
  archive_entry_set_size(ae,8);
  iVar1 = archive_write_header(paVar4,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(ae);
  lVar5 = archive_write_data(paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'>',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'C',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_atime(ae,2,0x14);
  archive_entry_set_birthtime(ae,8,0x50);
  archive_entry_set_ctime(ae,4,0x28);
  archive_entry_set_mtime(ae,5,0x32);
  archive_entry_copy_pathname(ae,"file2");
  archive_entry_set_mode(ae,0x81ed);
  archive_entry_set_size(ae,8);
  iVar1 = archive_write_header(paVar4,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(ae);
  lVar5 = archive_write_data(paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'M',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'V',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_atime(ae,2,0x14);
  archive_entry_set_birthtime(ae,3,0x1e);
  archive_entry_set_ctime(ae,4,0x28);
  archive_entry_set_mtime(ae,5,0x32);
  archive_entry_copy_pathname
            (ae,
             "file3_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789"
            );
  archive_entry_set_mode(ae,0x81ed);
  archive_entry_set_size(ae,0xfa008);
  archive_entry_sparse_add_entry(ae,0xfa000,8);
  iVar1 = archive_write_header(paVar4,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(ae);
  memset(nulls,0,0x400);
  for (uVar10 = 0; uVar10 < 0xfa000; uVar10 = uVar10 + 0x400) {
    lVar5 = archive_write_data(paVar4,nulls,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                        ,L'g',0x400,"1024",lVar5,"archive_write_data(a, nulls, 1024)",paVar4);
  }
  lVar5 = archive_write_data(paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'h',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
  ae = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'n',(uint)(ae != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_atime(ae,2,0x14);
  archive_entry_set_birthtime(ae,3,0x1e);
  archive_entry_set_ctime(ae,4,0x28);
  archive_entry_set_mtime(ae,5,0x32);
  archive_entry_copy_pathname(ae,"file4");
  archive_entry_set_mode(ae,0x81ed);
  archive_entry_set_size(ae,8);
  archive_entry_copy_uname(ae,"long-uname123456789012345678901234567890");
  archive_entry_copy_gname(ae,"long-gname123456789012345678901234567890");
  archive_entry_set_uid(ae,0x20000000);
  archive_entry_set_gid(ae,0x20000001);
  iVar1 = archive_write_header(paVar4,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(ae);
  lVar5 = archive_write_data(paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'~',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar4);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'\x8f',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x90',0,"0",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x91',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_open_memory(paVar4,local_460,used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x92',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",paVar4);
  iVar1 = archive_read_next_header(paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x97',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x98',2,"2",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  lVar7 = archive_entry_atime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x99',0x14,"20",lVar7,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9a',3,"3",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar7 = archive_entry_birthtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9b',0x1e,"30",lVar7,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9c',4,"4",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  lVar7 = archive_entry_ctime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9d',0x28,"40",lVar7,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9e',5,"5",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'\x9f',0x32,"50",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'\xa0',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'¡',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¢',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar5 = archive_read_data(paVar4,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'£',8,"8",lVar5,"archive_read_data(a, buff2, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¤',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'©',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  wVar3 = archive_entry_atime_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'ª',wVar3,"archive_entry_atime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'«',2,"2",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  lVar7 = archive_entry_atime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¬',0x14,"20",lVar7,"archive_entry_atime_nsec(ae)",(void *)0x0);
  wVar3 = archive_entry_birthtime_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'®',(uint)(wVar3 == L'\0'),"!archive_entry_birthtime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¯',0,"0",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar7 = archive_entry_birthtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'°',0,"0",lVar7,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  wVar3 = archive_entry_ctime_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'±',wVar3,"archive_entry_ctime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'²',4,"4",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  lVar7 = archive_entry_ctime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'³',0x28,"40",lVar7,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  wVar3 = archive_entry_mtime_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'´',wVar3,"archive_entry_mtime_is_set(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'µ',5,"5",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¶',0x32,"50",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'·',"file2","\"file2\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'¸',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'¹',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar5 = archive_read_data(paVar4,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'º',8,"8",lVar5,"archive_read_data(a, buff2, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'»',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&ae);
  local_458 = paVar4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'À',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Á',2,"2",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  lVar7 = archive_entry_atime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Â',0x14,"20",lVar7,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ã',3,"3",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar7 = archive_entry_birthtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ä',0x1e,"30",lVar7,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Å',4,"4",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  lVar7 = archive_entry_ctime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Æ',0x28,"40",lVar7,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ç',5,"5",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'È',0x32,"50",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'Í',
             "file3_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789_123456789"
             ,
             "\"file3\" \"_123456789_123456789_123456789_123456789_123456789\" \"_123456789_123456789_123456789_123456789_123456789\" \"_123456789_123456789_123456789_123456789_123456789\""
             ,pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'Î',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ï',0xfa008,"1024008",lVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar3 = archive_entry_sparse_reset(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ð',1,"1",(long)wVar3,"archive_entry_sparse_reset(ae)",(void *)0x0);
  wVar3 = archive_entry_sparse_next(ae,&offset,&length);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ò',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ó',0xfa000,"1024000",offset,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ô',8,"8",length,"length",(void *)0x0);
  for (uVar10 = 0; paVar4 = local_458, uVar10 < 0xfa000; uVar10 = uVar10 + 0x400) {
    lVar5 = archive_read_data(local_458,nulls,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                        ,L'×',0x400,"1024",lVar5,"archive_read_data(a, nulls, 1024)",paVar4);
    for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                          ,L'Ù',0,"0",(long)nulls[lVar7],"nulls[j]",(void *)0x0);
    }
  }
  lVar5 = archive_read_data(local_458,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Û',8,"8",lVar5,"archive_read_data(a, buff2, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'Ü',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'á',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  tVar6 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'â',2,"2",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  lVar7 = archive_entry_atime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ã',0x14,"20",lVar7,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_birthtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ä',3,"3",tVar6,"archive_entry_birthtime(ae)",(void *)0x0);
  lVar7 = archive_entry_birthtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'å',0x1e,"30",lVar7,"archive_entry_birthtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'æ',4,"4",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  lVar7 = archive_entry_ctime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ç',0x28,"40",lVar7,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'è',5,"5",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'é',0x32,"50",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'ê',"file4","\"file4\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar8 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'ì',"long-uname123456789012345678901234567890",
             "\"long-uname123456789012345678901234567890\"",pcVar8,"archive_entry_uname(ae)",
             (void *)0x0,L'\0');
  pcVar8 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
             ,L'î',"long-gname123456789012345678901234567890",
             "\"long-gname123456789012345678901234567890\"",pcVar8,"archive_entry_gname(ae)",
             (void *)0x0,L'\0');
  lVar9 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ï',0x20000000,"536870912",lVar9,"archive_entry_uid(ae)",(void *)0x0);
  lVar9 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ð',0x20000001,"536870913",lVar9,"archive_entry_gid(ae)",(void *)0x0);
  mVar2 = archive_entry_mode(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                   ,L'ñ',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  lVar9 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ò',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar5 = archive_read_data(paVar4,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ó',8,"8",lVar5,"archive_read_data(a, buff2, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ô',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ù',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_pax.c"
                      ,L'û',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",paVar4);
  free(local_460);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_pax)
{
	size_t buffsize = 1000000;
	char *buff;
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int i;
	char nulls[1024];
	int64_t offset, length;

	buff = malloc(buffsize); /* million bytes of work area */
	assert(buff != NULL);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file" has a bunch of attributes and 8 bytes of data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file2" is similar but has birthtime later than mtime.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 8, 80);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file3" is sparse file and has hole size of which is
	 * 1024000 bytes, and has 8 bytes data after the hole.
	 *
	 * Pad the filename to make it larger than the ustar limit.
	 * It should still read back correctly.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file3"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 1024008);
	archive_entry_sparse_add_entry(ae, 1024000, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	memset(nulls, 0, sizeof(nulls));
	for (i = 0; i < 1024000; i += 1024)
		/* write hole data, which won't be stored into an archive file. */
		assertEqualIntA(a, 1024, archive_write_data(a, nulls, 1024));
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file4" is similar to "file1" but has a large uid, large gid,
	 * uname and gname are longer than 32 characters
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file4");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	archive_entry_copy_uname(ae,
	    "long-uname123456789012345678901234567890");
	archive_entry_copy_gname(ae,
	    "long-gname123456789012345678901234567890");
	archive_entry_set_uid(ae, 536870912);
	archive_entry_set_gid(ae, 536870913);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * XXX TODO XXX Archive directory, other file types.
	 * Archive extended attributes, ACLs, other metadata.
	 * Verify they get read back correctly.
	 */

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	/*
	 *
	 * Now, read the data back.
	 *
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read "file"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(30, archive_entry_birthtime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file2"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(archive_entry_atime_is_set(ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	/* Birthtime > mtime above, so it doesn't get stored at all. */
	assert(!archive_entry_birthtime_is_set(ae));
	assertEqualInt(0, archive_entry_birthtime(ae));
	assertEqualInt(0, archive_entry_birthtime_nsec(ae));
	assert(archive_entry_ctime_is_set(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assert(archive_entry_mtime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file3"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(30, archive_entry_birthtime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file3"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789"
	    "_123456789_123456789_123456789_123456789_123456789",
	    archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(1024008, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_sparse_reset(ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(1024000, offset);
	assertEqualInt(8, length);
	for (i = 0; i < 1024000; i += 1024) {
		int j;
		assertEqualIntA(a, 1024, archive_read_data(a, nulls, 1024));
		for (j = 0; j < 1024; j++)
			assertEqualInt(0, nulls[j]);
	}
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file4
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(30, archive_entry_birthtime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(40, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(50, archive_entry_mtime_nsec(ae));
	assertEqualString("file4", archive_entry_pathname(ae));
	assertEqualString("long-uname123456789012345678901234567890",
	    archive_entry_uname(ae));
	assertEqualString("long-gname123456789012345678901234567890",
	    archive_entry_gname(ae));
	assertEqualInt(536870912, archive_entry_uid(ae));
	assertEqualInt(536870913, archive_entry_gid(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}